

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

LocalizedNumberFormatter * __thiscall
icu_63::number::LocalizedNumberFormatter::operator=(LocalizedNumberFormatter *this,LNF *src)

{
  LNF *src_local;
  LocalizedNumberFormatter *this_local;
  
  NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::operator=
            (&this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>,
             &src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>);
  if (src->fCompiled == (NumberFormatterImpl *)0x0) {
    clear(this);
  }
  else {
    lnfMoveHelper(this,src);
  }
  return this;
}

Assistant:

LocalizedNumberFormatter& LocalizedNumberFormatter::operator=(LNF&& src) U_NOEXCEPT {
    NFS<LNF>::operator=(static_cast<NFS<LNF>&&>(src));
    // For the move operators, copy over the compiled formatter.
    // Note: if the formatter is not compiled, call count information is lost.
    if (static_cast<LNF&&>(src).fCompiled != nullptr) {
        // Formatter is compiled
        lnfMoveHelper(static_cast<LNF&&>(src));
    } else {
        clear();
    }
    return *this;
}